

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

void Ivy_FraigCreateClasses(Ivy_FraigMan_t *p)

{
  Ivy_Obj_t *pIVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  void *__ptr;
  Ivy_Obj_t *pObj;
  Ivy_Obj_t **ppIVar6;
  Ivy_Obj_t *pIVar7;
  Vec_Ptr_t *p_00;
  Ivy_Obj_t *pObj0;
  Ivy_Man_t *pIVar8;
  int i;
  
  pIVar8 = p->pManAig;
  pIVar7 = pIVar8->pConst1;
  iVar3 = (pIVar8->nCreated - pIVar8->nDeleted) / 2;
  __ptr = calloc(1,(long)iVar3 * 8 + 0x68);
  i = 0;
  do {
    p_00 = pIVar8->vObjs;
    iVar5 = p_00->nSize;
    if (iVar5 <= i) {
      if ((p->lClasses).pHead != (Ivy_Obj_t *)0x0) {
        __assert_fail("p->lClasses.pHead == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                      ,0x4bb,"void Ivy_FraigCreateClasses(Ivy_FraigMan_t *)");
      }
      iVar3 = 0;
      do {
        if (iVar5 <= iVar3) {
          free(__ptr);
          return;
        }
        pIVar7 = (Ivy_Obj_t *)Vec_PtrEntry(p_00,iVar3);
        if ((pIVar7 != (Ivy_Obj_t *)0x0) &&
           ((pIVar7->Id == 0 ||
            ((uVar4 = *(uint *)&pIVar7->field_0x8 & 0xf, uVar4 < 7 && ((0x62U >> uVar4 & 1) != 0))))
           )) {
          pIVar7->pPrevFan0 = (Ivy_Obj_t *)0x0;
          if (pIVar7->pNextFan0 == (Ivy_Obj_t *)0x0) {
            if (pIVar7->pNextFan1 != (Ivy_Obj_t *)0x0) {
              __assert_fail("Ivy_ObjClassNodeNext(pObj) == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                            ,0x4c3,"void Ivy_FraigCreateClasses(Ivy_FraigMan_t *)");
            }
          }
          else if (pIVar7->pNextFan0->pNextFan1 == (Ivy_Obj_t *)0x0) {
            pIVar7->pNextFan0 = (Ivy_Obj_t *)0x0;
            Ivy_FraigAddClass(&p->lClasses,pIVar7);
          }
        }
        iVar3 = iVar3 + 1;
        p_00 = p->pManAig->vObjs;
        iVar5 = p_00->nSize;
      } while( true );
    }
    pObj = (Ivy_Obj_t *)Vec_PtrEntry(p_00,i);
    if (((pObj != (Ivy_Obj_t *)0x0) && (uVar4 = *(uint *)&pObj->field_0x8 & 0xf, uVar4 < 7)) &&
       ((0x62U >> uVar4 & 1) != 0)) {
      uVar4 = Ivy_NodeHash(p,pObj);
      if ((uVar4 == 0) && (iVar5 = Ivy_NodeHasZeroSim(p,pObj), iVar5 != 0)) {
        ppIVar6 = &pIVar7->pNextFan1;
        if (pIVar7->pNextFan1 != (Ivy_Obj_t *)0x0) {
          ppIVar6 = &pIVar7->pNextFan0->pNextFan1;
        }
        *ppIVar6 = pObj;
        pIVar7->pNextFan0 = pObj;
        pObj->pNextFan0 = pIVar7;
        pObj->pNextFan1 = (Ivy_Obj_t *)0x0;
      }
      else {
        uVar2 = (ulong)uVar4 % (ulong)(iVar3 + 0xd);
        pIVar1 = *(Ivy_Obj_t **)((long)__ptr + uVar2 * 8);
        for (pObj0 = pIVar1; pObj0 != (Ivy_Obj_t *)0x0; pObj0 = pObj0->pPrevFan0) {
          iVar5 = Ivy_NodeCompareSims(p,pObj0,pObj);
          if (iVar5 != 0) {
            pIVar1 = pObj0;
            if (pObj0->pNextFan1 != (Ivy_Obj_t *)0x0) {
              pIVar1 = pObj0->pNextFan0;
            }
            pIVar1->pNextFan1 = pObj;
            pObj0->pNextFan0 = pObj;
            pObj->pNextFan0 = pObj0;
            pObj->pNextFan1 = (Ivy_Obj_t *)0x0;
            goto LAB_00652ada;
          }
        }
        pObj->pPrevFan0 = pIVar1;
        *(Ivy_Obj_t **)((long)__ptr + uVar2 * 8) = pObj;
      }
    }
LAB_00652ada:
    i = i + 1;
    pIVar8 = p->pManAig;
  } while( true );
}

Assistant:

void Ivy_FraigCreateClasses( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t ** pTable;
    Ivy_Obj_t * pObj, * pConst1, * pBin, * pEntry;
    int i, nTableSize;
    unsigned Hash;
    pConst1 = Ivy_ManConst1(p->pManAig);
    // allocate the table
    nTableSize = Ivy_ManObjNum(p->pManAig) / 2 + 13;
    pTable = ABC_ALLOC( Ivy_Obj_t *, nTableSize ); 
    memset( pTable, 0, sizeof(Ivy_Obj_t *) * nTableSize );
    // collect nodes into the table
    Ivy_ManForEachObj( p->pManAig, pObj, i )
    {
        if ( !Ivy_ObjIsPi(pObj) && !Ivy_ObjIsNode(pObj) )
            continue;
        Hash = Ivy_NodeHash( p, pObj );
        if ( Hash == 0 && Ivy_NodeHasZeroSim( p, pObj ) )
        {
            Ivy_NodeAddToClass( pConst1, pObj );
            continue;
        }
        // add the node to the table
        pBin = pTable[Hash % nTableSize];
        Ivy_FraigForEachBinNode( pBin, pEntry )
            if ( Ivy_NodeCompareSims( p, pEntry, pObj ) )
            {
                Ivy_NodeAddToClass( pEntry, pObj );
                break;
            }
        // check if the entry was added
        if ( pEntry )
            continue;
        Ivy_ObjSetNodeHashNext( pObj, pBin );
        pTable[Hash % nTableSize] = pObj;
    }
    // collect non-trivial classes
    assert( p->lClasses.pHead == NULL );
    Ivy_ManForEachObj( p->pManAig, pObj, i )
    {
        if ( !Ivy_ObjIsConst1(pObj) && !Ivy_ObjIsPi(pObj) && !Ivy_ObjIsNode(pObj) )
            continue;
        Ivy_ObjSetNodeHashNext( pObj, NULL );
        if ( Ivy_ObjClassNodeRepr(pObj) == NULL )
        {
            assert( Ivy_ObjClassNodeNext(pObj) == NULL );
            continue;
        }
        // recognize the head of the class
        if ( Ivy_ObjClassNodeNext( Ivy_ObjClassNodeRepr(pObj) ) != NULL )
            continue;
        // clean the class representative and add it to the list
        Ivy_ObjSetClassNodeRepr( pObj, NULL );
        Ivy_FraigAddClass( &p->lClasses, pObj );
    }
    // free the table
    ABC_FREE( pTable );
}